

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O2

ssize_t __thiscall fmt::v5::file::read(file *this,int __fd,void *__buf,size_t __nbytes)

{
  int error_code;
  ssize_t value;
  int *piVar1;
  system_error *this_00;
  size_t sVar2;
  type tVar3;
  undefined4 in_register_00000034;
  string_view message;
  
  do {
    value = ::read(this->fd_,(void *)CONCAT44(in_register_00000034,__fd),(size_t)__buf);
    if (value != -1) {
      if (-1 < value) {
        tVar3 = internal::to_unsigned<long>(value);
        return tVar3;
      }
      break;
    }
    piVar1 = __errno_location();
  } while (*piVar1 == 4);
  this_00 = (system_error *)__cxa_allocate_exception(0x18);
  piVar1 = __errno_location();
  error_code = *piVar1;
  sVar2 = internal::length<char>("cannot read from file");
  message.size_ = sVar2;
  message.data_ = "cannot read from file";
  system_error::system_error<>(this_00,error_code,message);
  __cxa_throw(this_00,&system_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::size_t file::read(void *buffer, std::size_t count) {
  RWResult result = 0;
  FMT_RETRY(result, FMT_POSIX_CALL(read(fd_, buffer, convert_rwcount(count))));
  if (result < 0)
    FMT_THROW(system_error(errno, "cannot read from file"));
  return internal::to_unsigned(result);
}